

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_paged_audio_buffer_read_pcm_frames
                    (ma_paged_audio_buffer *pPagedAudioBuffer,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  ma_format mVar1;
  ma_uint32 mVar2;
  ma_paged_audio_buffer_page *pmVar3;
  bool bVar4;
  ulong uVar5;
  ma_uint64 mVar6;
  ma_uint8 *__src;
  undefined1 *__dest;
  ma_uint64 mVar7;
  ulong uVar8;
  ma_result local_44;
  
  if (pPagedAudioBuffer == (ma_paged_audio_buffer *)0x0) {
    local_44 = MA_INVALID_ARGS;
  }
  else {
    mVar1 = pPagedAudioBuffer->pData->format;
    mVar2 = pPagedAudioBuffer->pData->channels;
    mVar7 = 0;
    local_44 = MA_SUCCESS;
    do {
      uVar5 = frameCount - mVar7;
      if (frameCount < mVar7 || uVar5 == 0) break;
      uVar8 = pPagedAudioBuffer->pCurrent->sizeInFrames - pPagedAudioBuffer->relativeCursor;
      if (uVar5 <= uVar8) {
        uVar8 = uVar5;
      }
      uVar5 = (ulong)((&DAT_0017d490)[mVar1] * mVar2);
      __dest = (undefined1 *)(mVar7 * uVar5 + (long)pFramesOut);
      __src = pPagedAudioBuffer->pCurrent->pAudioData + pPagedAudioBuffer->relativeCursor * uVar5;
      if (__dest != __src) {
        memcpy(__dest,__src,uVar5 * uVar8);
      }
      pPagedAudioBuffer->absoluteCursor = pPagedAudioBuffer->absoluteCursor + uVar8;
      mVar6 = pPagedAudioBuffer->relativeCursor + uVar8;
      pPagedAudioBuffer->relativeCursor = mVar6;
      bVar4 = true;
      if (mVar6 == pPagedAudioBuffer->pCurrent->sizeInFrames) {
        pmVar3 = pPagedAudioBuffer->pCurrent->pNext;
        bVar4 = pmVar3 != (ma_paged_audio_buffer_page *)0x0;
        if (pmVar3 == (ma_paged_audio_buffer_page *)0x0) {
          local_44 = MA_AT_END;
        }
        else {
          pPagedAudioBuffer->pCurrent = pmVar3;
          pPagedAudioBuffer->relativeCursor = 0;
        }
      }
      mVar7 = mVar7 + uVar8;
    } while (bVar4);
    if (pFramesRead != (ma_uint64 *)0x0) {
      *pFramesRead = mVar7;
    }
  }
  return local_44;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_read_pcm_frames(ma_paged_audio_buffer* pPagedAudioBuffer, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_result result = MA_SUCCESS;
    ma_uint64 totalFramesRead = 0;
    ma_format format;
    ma_uint32 channels;

    if (pPagedAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    format   = pPagedAudioBuffer->pData->format;
    channels = pPagedAudioBuffer->pData->channels;

    while (totalFramesRead < frameCount) {
        /* Read from the current page. The buffer should never be in a state where this is NULL. */
        ma_uint64 framesRemainingInCurrentPage;
        ma_uint64 framesRemainingToRead = frameCount - totalFramesRead;
        ma_uint64 framesToReadThisIteration;

        MA_ASSERT(pPagedAudioBuffer->pCurrent != NULL);

        framesRemainingInCurrentPage = pPagedAudioBuffer->pCurrent->sizeInFrames - pPagedAudioBuffer->relativeCursor;

        framesToReadThisIteration = ma_min(framesRemainingInCurrentPage, framesRemainingToRead);
        ma_copy_pcm_frames(ma_offset_pcm_frames_ptr(pFramesOut, totalFramesRead, format, channels), ma_offset_pcm_frames_ptr(pPagedAudioBuffer->pCurrent->pAudioData, pPagedAudioBuffer->relativeCursor, format, channels), framesToReadThisIteration, format, channels);
        totalFramesRead += framesToReadThisIteration;

        pPagedAudioBuffer->absoluteCursor += framesToReadThisIteration;
        pPagedAudioBuffer->relativeCursor += framesToReadThisIteration;

        /* Move to the next page if necessary. If there's no more pages, we need to return MA_AT_END. */
        MA_ASSERT(pPagedAudioBuffer->relativeCursor <= pPagedAudioBuffer->pCurrent->sizeInFrames);

        if (pPagedAudioBuffer->relativeCursor == pPagedAudioBuffer->pCurrent->sizeInFrames) {
            /* We reached the end of the page. Need to move to the next. If there's no more pages, we're done. */
            ma_paged_audio_buffer_page* pNext = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&pPagedAudioBuffer->pCurrent->pNext);
            if (pNext == NULL) {
                result = MA_AT_END;
                break;  /* We've reached the end. */
            } else {
                pPagedAudioBuffer->pCurrent       = pNext;
                pPagedAudioBuffer->relativeCursor = 0;
            }
        }
    }

    if (pFramesRead != NULL) {
        *pFramesRead = totalFramesRead;
    }

    return result;
}